

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O0

Clause * __thiscall EditDistance::getNaiveExplanation(EditDistance *this)

{
  IntVar *pIVar1;
  Lit LVar2;
  Clause *pCVar3;
  Lit *pLVar4;
  IntView<0> *in_RDI;
  int i_1;
  int i;
  int offset;
  Clause *r;
  int clauseSize;
  undefined8 in_stack_ffffffffffffffb8;
  int iVar5;
  IntView<0> *in_stack_ffffffffffffffc0;
  int local_28;
  int local_20;
  
  pCVar3 = ::Reason_new((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  for (local_20 = 0; local_20 < *(int *)&in_RDI[5].var; local_20 = local_20 + 1) {
    in_stack_ffffffffffffffc0 = (IntView<0> *)(*(long *)&in_RDI[5].a + (long)local_20 * 0x10);
    IntView<0>::getVal(in_stack_ffffffffffffffc0);
    iVar5 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    LVar2 = IntView<0>::getLit(in_RDI,(int64_t)in_stack_ffffffffffffffc0,iVar5);
    pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffffc0,iVar5);
    pLVar4->x = LVar2.x;
  }
  for (local_28 = 0; local_28 < *(int *)&in_RDI[5].var; local_28 = local_28 + 1) {
    pIVar1 = in_RDI[6].var;
    IntView<0>::getVal(in_stack_ffffffffffffffc0);
    iVar5 = (int)((ulong)(&pIVar1->super_Var + (long)local_28 * 2) >> 0x20);
    LVar2 = IntView<0>::getLit(in_RDI,(int64_t)in_stack_ffffffffffffffc0,iVar5);
    pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffffc0,iVar5);
    pLVar4->x = LVar2.x;
  }
  return pCVar3;
}

Assistant:

Clause* getNaiveExplanation() const {
		// count number of possible values in total

		const int clauseSize = seqSize * 2 + 1;

		Clause* r = Reason_new(clauseSize);

		int offset = 1;

		// insert all clauses for each variable in sequence 1
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq1[i].getLit(seq1[i].getVal(), LR_NE);
		}
		offset += seqSize;
		// insert all clauses for each variable in sequence 2
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq2[i].getLit(seq2[i].getVal(), LR_NE);
		}

		return r;
	}